

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodCompiler::visitBlockExpression(MethodCompiler *this,BlockExpression *node)

{
  FunctionalNode *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int vectorIndex;
  undefined4 extraout_var;
  Label *blockEnd_00;
  undefined4 extraout_var_00;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *this_01;
  LocalVariables *this_02;
  value_type *pvVar4;
  __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var5;
  element_type *peVar6;
  size_t sVar7;
  InstructionNode *pIVar8;
  SequenceNode *pSVar9;
  InstructionNode *pIVar10;
  InstructionNode *closureBeginInstruction;
  value_type *localVar_2;
  size_t i_3;
  value_type *localVar_1;
  size_t i_2;
  int i_1;
  size_t oldArgumentCount;
  size_t numLocals;
  size_t numCopied;
  value_type *localVar;
  size_t i;
  int capturedCount;
  LocalVariables *blockLocals;
  size_t argumentCount;
  ArgumentList *argumentList;
  Label *blockEnd;
  FunctionalNode *oldLocalContext;
  BlockExpression *node_local;
  MethodCompiler *this_local;
  
  uVar2 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])();
  if ((uVar2 & 1) == 0) {
    this_00 = this->localContext;
    this->localContext = &node->super_FunctionalNode;
    blockEnd_00 = MethodAssembler::Assembler::makeLabel(&this->gen);
    iVar3 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])();
    blockLocals = (LocalVariables *)0x0;
    if ((ArgumentList *)CONCAT44(extraout_var_00,iVar3) != (ArgumentList *)0x0) {
      this_01 = AST::ArgumentList::getArguments((ArgumentList *)CONCAT44(extraout_var_00,iVar3));
      blockLocals = (LocalVariables *)
                    std::vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                    ::size(this_01);
    }
    this_02 = AST::FunctionalNode::getLocalVariables(&node->super_FunctionalNode);
    i._4_4_ = 0;
    for (localVar = (value_type *)0x0;
        pvVar4 = (value_type *)
                 std::
                 vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                 ::size(this_02), localVar < pvVar4;
        localVar = (value_type *)
                   ((long)&(localVar->
                           super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + 1)) {
      p_Var5 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                  ::operator[](this_02,(size_type)localVar);
      peVar6 = std::
               __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var5);
      bVar1 = TemporalVariableLookup::isCapturedInClosure(peVar6);
      if (bVar1) {
        peVar6 = std::
                 __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        TemporalVariableLookup::setTemporalVectorIndex(peVar6,this->temporalVectorCount);
        peVar6 = std::
                 __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        TemporalVariableLookup::setTemporalIndex(peVar6,i._4_4_);
        i._4_4_ = i._4_4_ + 1;
      }
    }
    numLocals = (size_t)this->temporalVectorCount;
    if (this->temporalVectorCount != 0) {
      sVar7 = AST::FunctionalNode::getArgumentCount(this_00);
      for (i_2._4_4_ = 0; i_2._4_4_ < this->temporalVectorCount; i_2._4_4_ = i_2._4_4_ + 1) {
        MethodAssembler::Assembler::pushTemporal(&this->gen,(int)sVar7 + i_2._4_4_);
      }
    }
    if (i._4_4_ != 0) {
      this->temporalVectorCount = this->temporalVectorCount + 1;
      numLocals = numLocals + 1;
    }
    oldArgumentCount = (size_t)(i._4_4_ != 0);
    localVar_1 = (value_type *)0x0;
    while( true ) {
      pvVar4 = (value_type *)
               std::
               vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               ::size(this_02);
      iVar3 = (int)blockLocals;
      if (pvVar4 <= localVar_1) break;
      p_Var5 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)std::
                  vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                  ::operator[](this_02,(size_type)localVar_1);
      peVar6 = std::
               __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var5);
      bVar1 = TemporalVariableLookup::isCapturedInClosure(peVar6);
      if (!bVar1) {
        if (localVar_1 < blockLocals) {
          peVar6 = std::
                   __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var5);
          TemporalVariableLookup::setTemporalIndex(peVar6,(int)localVar_1);
        }
        else {
          peVar6 = std::
                   __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var5);
          TemporalVariableLookup::setTemporalIndex(peVar6,iVar3 + (int)numLocals);
          oldArgumentCount = oldArgumentCount + 1;
          numLocals = numLocals + 1;
        }
      }
      localVar_1 = (value_type *)
                   ((long)&(localVar_1->
                           super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr + 1);
    }
    if (oldArgumentCount != 0) {
      MethodAssembler::Assembler::pushNClosureTemps(&this->gen,(int)oldArgumentCount);
    }
    MethodAssembler::Assembler::pushClosure(&this->gen,(int)numLocals,iVar3,blockEnd_00,0);
    if (i._4_4_ != 0) {
      MethodAssembler::Assembler::pushNewArray(&this->gen,i._4_4_);
      MethodAssembler::Assembler::popStoreTemporal
                (&this->gen,iVar3 + this->temporalVectorCount + -1);
      for (localVar_2 = (value_type *)0x0; localVar_2 < blockLocals;
          localVar_2 = (value_type *)
                       ((long)&(localVar_2->
                               super___shared_ptr<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + 1)) {
        p_Var5 = (__shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)std::
                    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
                    ::operator[](this_02,(size_type)localVar_2);
        peVar6 = std::
                 __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(p_Var5);
        bVar1 = TemporalVariableLookup::isCapturedInClosure(peVar6);
        if (bVar1) {
          MethodAssembler::Assembler::pushTemporal(&this->gen,(int)localVar_2);
          peVar6 = std::
                   __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var5);
          iVar3 = TemporalVariableLookup::getTemporalIndex(peVar6);
          peVar6 = std::
                   __shared_ptr_access<Lodtalk::TemporalVariableLookup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(p_Var5);
          vectorIndex = TemporalVariableLookup::getTemporalVectorIndex(peVar6);
          MethodAssembler::Assembler::popStoreTemporalInVector(&this->gen,iVar3,vectorIndex);
        }
      }
    }
    pIVar8 = MethodAssembler::Assembler::getLastInstruction(&this->gen);
    pSVar9 = AST::BlockExpression::getBody(node);
    (*(pSVar9->super_Node)._vptr_Node[2])(pSVar9,this);
    bVar1 = MethodAssembler::Assembler::isLastReturn(&this->gen);
    if (!bVar1) {
      pIVar10 = MethodAssembler::Assembler::getLastInstruction(&this->gen);
      if (pIVar10 == pIVar8) {
        MethodAssembler::Assembler::blockReturnNil(&this->gen);
      }
      else {
        MethodAssembler::Assembler::blockReturnTop(&this->gen);
      }
    }
    MethodAssembler::Assembler::putLabel(&this->gen,blockEnd_00);
    this->localContext = this_00;
    if (i._4_4_ != 0) {
      this->temporalVectorCount = this->temporalVectorCount + -1;
    }
    Oop::Oop((Oop *)&this_local);
  }
  else {
    pSVar9 = AST::BlockExpression::getBody(node);
    iVar3 = (*(pSVar9->super_Node)._vptr_Node[2])(pSVar9,this);
    this_local = (MethodCompiler *)CONCAT44(extraout_var,iVar3);
  }
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodCompiler::visitBlockExpression(BlockExpression *node)
{
    if(node->isInlined())
    {
        // Visit the method body
        return node->getBody()->acceptVisitor(this);
    }

    // Store the local context
    auto oldLocalContext = localContext;
    localContext = node;

    auto blockEnd = gen.makeLabel();

    // Process the arguments
    auto argumentList = node->getArgumentList();
    size_t argumentCount = 0;
    if(argumentList)
        argumentCount = argumentList->getArguments().size();

    // Count the captured variables.
    auto &blockLocals = node->getLocalVariables();
    auto capturedCount = 0;
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
        {
            localVar->setTemporalVectorIndex(temporalVectorCount);
            localVar->setTemporalIndex(capturedCount++);
        }
    }

    // Push the captured temporal vectors.
    size_t numCopied = temporalVectorCount;
    size_t numLocals = 0;
    if(temporalVectorCount)
    {
        auto oldArgumentCount = oldLocalContext->getArgumentCount();
        for(auto i = 0; i < temporalVectorCount; ++i)
            gen.pushTemporal(int(oldArgumentCount + i));

    }

    if(capturedCount)
    {
        ++temporalVectorCount;

        // Reserve space for the inner temporal vector.
        ++numLocals;
        ++numCopied;
    }

    // Prepare the local variables of the block.
    for(size_t i = 0; i < blockLocals.size(); ++i)
    {
        auto &localVar = blockLocals[i];
        if(localVar->isCapturedInClosure())
            continue;

        if(i < argumentCount)
        {
            localVar->setTemporalIndex((int)i);
        }
        else
        {
            localVar->setTemporalIndex(int(argumentCount + numCopied));
            ++numLocals;
            ++numCopied;
        }
    }

    // Reserve space for the locals.
    if(numLocals)
        gen.pushNClosureTemps((int)numLocals);

    // Push the block.
    gen.pushClosure((int)numCopied, (int)argumentCount, blockEnd, 0);

    // Generate the inner temporal vector.
    if(capturedCount)
    {
        gen.pushNewArray(capturedCount);
        gen.popStoreTemporal(int(argumentCount + temporalVectorCount - 1));

        // Copy the captured arguments into the temp vector
        for(size_t i = 0; i < argumentCount; ++i)
        {
            auto &localVar = blockLocals[i];
            if(localVar->isCapturedInClosure())
            {
                gen.pushTemporal((int)i);
                gen.popStoreTemporalInVector(localVar->getTemporalIndex(), localVar->getTemporalVectorIndex());
            }
        }
    }

    auto closureBeginInstruction = gen.getLastInstruction();

    // Generate the block body.
    node->getBody()->acceptVisitor(this);

    // Always return
	if(!gen.isLastReturn())
    {
        if(gen.getLastInstruction() == closureBeginInstruction)
            gen.blockReturnNil();
        else
            gen.blockReturnTop();
    }

    // Finish the block.
    gen.putLabel(blockEnd);

    // Restore the local context
    localContext = oldLocalContext;

    if(capturedCount)
        --temporalVectorCount;

	return Oop();
}